

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

void __thiscall
moira::StrWriter::briefExtension<(moira::Mode)6,(moira::Size)2>
          (StrWriter *this,Ea<(moira::Mode)6,_(moira::Size)2> *ea)

{
  uint uVar1;
  char *pcVar2;
  u16 uVar3;
  
  uVar1 = ea->ext1;
  operator<<(this,"(");
  if ((char)uVar1 != '\0') {
    operator<<(this,(Int)(int)(char)uVar1);
    operator<<(this,",");
  }
  uVar3 = ea->reg;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = 'A';
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (char)uVar3 + '0';
  operator<<(this,",");
  operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
  if ((uVar1 >> 0xb & 1) == 0) {
    operator<<();
  }
  else {
    operator<<(this);
  }
  operator<<(this,(Scale)(uVar1 >> 9 & 3));
  operator<<(this,")");
  return;
}

Assistant:

void
StrWriter::briefExtension(const Ea<M,S> &ea)
{
    assert(M == 6 || M == 10);

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 0  | DISPLACEMENT                         |
    // -----------------------------------------------------------------------

    u16 reg   = xxxx____________ (ea.ext1);
    u16 lw    = ____x___________ (ea.ext1);
    u16 scale = _____xx_________ (ea.ext1);
    u16 disp  = ________xxxxxxxx (ea.ext1);

    *this << "(";
    if (disp) *this << Int{(i8)disp} << ",";
    M == 10 ? *this << "PC" : *this << An{ea.reg};
    *this << "," << Rn{reg};
    lw ? *this << Sz<Long>{} : *this << Sz<Word>{};
    *this << Scale{scale} << ")";
}